

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O0

upb_FieldDef * upb_DefPool_FindExtensionByNameWithSize(upb_DefPool *s,char *name,size_t size)

{
  _Bool _Var1;
  upb_deftype_t uVar2;
  int iVar3;
  upb_MessageDef *m_00;
  upb_FieldDef *f;
  upb_MessageDef *puVar4;
  upb_FieldDef *ext;
  int i;
  upb_MessageDef *m;
  upb_value v;
  size_t size_local;
  char *name_local;
  upb_DefPool *s_local;
  
  v.val = size;
  _Var1 = upb_strtable_lookup2(&s->syms,name,size,(upb_value *)&m);
  if (_Var1) {
    uVar2 = _upb_DefType_Type((upb_value)m);
    if (uVar2 == UPB_DEFTYPE_EXT) {
      s_local = (upb_DefPool *)_upb_DefType_Unpack((upb_value)m,UPB_DEFTYPE_EXT);
    }
    else if (uVar2 == UPB_DEFTYPE_MSG) {
      m_00 = (upb_MessageDef *)_upb_DefType_Unpack((upb_value)m,UPB_DEFTYPE_MSG);
      _Var1 = _upb_MessageDef_InMessageSet(m_00);
      if (_Var1) {
        for (ext._4_4_ = 0; iVar3 = upb_MessageDef_NestedExtensionCount(m_00), ext._4_4_ < iVar3;
            ext._4_4_ = ext._4_4_ + 1) {
          f = upb_MessageDef_NestedExtension(m_00,ext._4_4_);
          puVar4 = upb_FieldDef_MessageSubDef(f);
          if (puVar4 == m_00) {
            return f;
          }
        }
      }
      s_local = (upb_DefPool *)0x0;
    }
    else {
      s_local = (upb_DefPool *)0x0;
    }
  }
  else {
    s_local = (upb_DefPool *)0x0;
  }
  return (upb_FieldDef *)s_local;
}

Assistant:

const upb_FieldDef* upb_DefPool_FindExtensionByNameWithSize(
    const upb_DefPool* s, const char* name, size_t size) {
  upb_value v;
  if (!upb_strtable_lookup2(&s->syms, name, size, &v)) return NULL;

  switch (_upb_DefType_Type(v)) {
    case UPB_DEFTYPE_FIELD:
      return _upb_DefType_Unpack(v, UPB_DEFTYPE_FIELD);
    case UPB_DEFTYPE_MSG: {
      const upb_MessageDef* m = _upb_DefType_Unpack(v, UPB_DEFTYPE_MSG);
      if (_upb_MessageDef_InMessageSet(m)) {
        for (int i = 0; i < upb_MessageDef_NestedExtensionCount(m); i++) {
          const upb_FieldDef* ext = upb_MessageDef_NestedExtension(m, i);
          if (upb_FieldDef_MessageSubDef(ext) == m) {
            return ext;
          }
        }
      }
      return NULL;
    }
    default:
      break;
  }

  return NULL;
}